

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printU4ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  MCOperand *op;
  SStream *O_00;
  uint8_t *puVar2;
  uint in_ESI;
  MCInst *in_RDI;
  int64_t Value;
  int64_t in_stack_ffffffffffffffd8;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  O_00 = (SStream *)MCOperand_getImm(op);
  printInt64(O_00,in_stack_ffffffffffffffd8);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar2 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar2[0] = '\x02';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    *(SStream **)
     (in_RDI->flat_insn->detail->groups +
     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1d) = O_00;
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printU4ImmOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned int Value = (int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	//assert(Value <= 15 && "Invalid u4imm argument!");

	if (Value > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", Value);
	else
		SStream_concat(O, "%u", Value);

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Value;
		MI->flat_insn->detail->ppc.op_count++;
	}
}